

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O2

void enet_peer_setup_outgoing_command(ENetPeer *peer,ENetOutgoingCommand *outgoingCommand)

{
  undefined2 uVar1;
  ushort uVar2;
  size_t sVar3;
  byte bVar4;
  ushort uVar5;
  ENetChannel *pEVar6;
  
  pEVar6 = peer->channels + (outgoingCommand->command).header.channelID;
  sVar3 = enet_protocol_command_size((outgoingCommand->command).header.command);
  peer->outgoingDataTotal =
       peer->outgoingDataTotal + (int)sVar3 + (uint)outgoingCommand->fragmentLength;
  if ((outgoingCommand->command).header.channelID == 0xff) {
    uVar5 = (short)*(undefined4 *)&peer->outgoingReliableSequenceNumber + 1;
    peer->outgoingReliableSequenceNumber = uVar5;
LAB_00158877:
    uVar2 = 0;
  }
  else {
    bVar4 = (outgoingCommand->command).header.command;
    if ((char)bVar4 < '\0') {
      uVar1 = pEVar6->outgoingReliableSequenceNumber;
      uVar5 = uVar1 + 1;
      pEVar6->outgoingReliableSequenceNumber = uVar5;
      pEVar6->outgoingUnreliableSequenceNumber = 0;
      goto LAB_00158877;
    }
    if (0x3f < bVar4) {
      peer->outgoingUnsequencedGroup = peer->outgoingUnsequencedGroup + 1;
      uVar5 = 0;
      goto LAB_00158877;
    }
    uVar2 = pEVar6->outgoingUnreliableSequenceNumber;
    if (outgoingCommand->fragmentOffset == 0) {
      uVar2 = uVar2 + 1;
      pEVar6->outgoingUnreliableSequenceNumber = uVar2;
    }
    uVar5 = pEVar6->outgoingReliableSequenceNumber;
  }
  outgoingCommand->reliableSequenceNumber = uVar5;
  outgoingCommand->unreliableSequenceNumber = uVar2;
  outgoingCommand->sendAttempts = 0;
  outgoingCommand->sentTime = 0;
  outgoingCommand->roundTripTimeout = 0;
  outgoingCommand->roundTripTimeoutLimit = 0;
  (outgoingCommand->command).header.reliableSequenceNumber = uVar5 << 8 | uVar5 >> 8;
  bVar4 = (outgoingCommand->command).header.command & 0xf;
  if (bVar4 != 7) {
    if (bVar4 != 9) goto LAB_001588b8;
    uVar2 = peer->outgoingUnsequencedGroup;
  }
  (outgoingCommand->command).acknowledge.receivedReliableSequenceNumber = uVar2 << 8 | uVar2 >> 8;
LAB_001588b8:
  enet_list_insert(&(peer->outgoingCommands).sentinel,outgoingCommand);
  return;
}

Assistant:

void
enet_peer_setup_outgoing_command (ENetPeer * peer, ENetOutgoingCommand * outgoingCommand)
{
    ENetChannel * channel = & peer -> channels [outgoingCommand -> command.header.channelID];
    
    peer -> outgoingDataTotal += enet_protocol_command_size (outgoingCommand -> command.header.command) + outgoingCommand -> fragmentLength;

    if (outgoingCommand -> command.header.channelID == 0xFF)
    {
       ++ peer -> outgoingReliableSequenceNumber;

       outgoingCommand -> reliableSequenceNumber = peer -> outgoingReliableSequenceNumber;
       outgoingCommand -> unreliableSequenceNumber = 0;
    }
    else
    if (outgoingCommand -> command.header.command & ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE)
    {
       ++ channel -> outgoingReliableSequenceNumber;
       channel -> outgoingUnreliableSequenceNumber = 0;

       outgoingCommand -> reliableSequenceNumber = channel -> outgoingReliableSequenceNumber;
       outgoingCommand -> unreliableSequenceNumber = 0;
    }
    else
    if (outgoingCommand -> command.header.command & ENET_PROTOCOL_COMMAND_FLAG_UNSEQUENCED)
    {
       ++ peer -> outgoingUnsequencedGroup;

       outgoingCommand -> reliableSequenceNumber = 0;
       outgoingCommand -> unreliableSequenceNumber = 0;
    }
    else
    {
       if (outgoingCommand -> fragmentOffset == 0)
         ++ channel -> outgoingUnreliableSequenceNumber;
        
       outgoingCommand -> reliableSequenceNumber = channel -> outgoingReliableSequenceNumber;
       outgoingCommand -> unreliableSequenceNumber = channel -> outgoingUnreliableSequenceNumber;
    }
   
    outgoingCommand -> sendAttempts = 0;
    outgoingCommand -> sentTime = 0;
    outgoingCommand -> roundTripTimeout = 0;
    outgoingCommand -> roundTripTimeoutLimit = 0;
    outgoingCommand -> command.header.reliableSequenceNumber = ENET_HOST_TO_NET_16 (outgoingCommand -> reliableSequenceNumber);

    switch (outgoingCommand -> command.header.command & ENET_PROTOCOL_COMMAND_MASK)
    {
    case ENET_PROTOCOL_COMMAND_SEND_UNRELIABLE:
        outgoingCommand -> command.sendUnreliable.unreliableSequenceNumber = ENET_HOST_TO_NET_16 (outgoingCommand -> unreliableSequenceNumber);
        break;

    case ENET_PROTOCOL_COMMAND_SEND_UNSEQUENCED:
        outgoingCommand -> command.sendUnsequenced.unsequencedGroup = ENET_HOST_TO_NET_16 (peer -> outgoingUnsequencedGroup);
        break;
    
    default:
        break;
    }

    enet_list_insert (enet_list_end (& peer -> outgoingCommands), outgoingCommand);
}